

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall
btMatrixX<float>::multiply2_p8r
          (btMatrixX<float> *this,btScalar *B,btScalar *C,int numRows,int numRowsOther,int row,
          int col)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  float *pfVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  
  iVar16 = this->m_setElemOperations;
  uVar17 = 0;
  uVar15 = (ulong)(uint)numRowsOther;
  if (numRowsOther < 1) {
    uVar15 = uVar17;
  }
  if (numRows < 1) {
    numRows = 0;
  }
  for (; (int)uVar17 != numRows; uVar17 = (ulong)((int)uVar17 + 1)) {
    pfVar14 = (this->m_storage).m_data;
    iVar13 = this->m_cols;
    for (lVar18 = 0; uVar15 * 4 != lVar18; lVar18 = lVar18 + 4) {
      fVar1 = *B;
      fVar2 = C[lVar18 * 2];
      fVar3 = B[1];
      fVar4 = C[lVar18 * 2 + 1];
      fVar5 = B[2];
      fVar6 = C[lVar18 * 2 + 2];
      fVar7 = B[4];
      fVar8 = C[lVar18 * 2 + 4];
      fVar9 = B[5];
      fVar10 = C[lVar18 * 2 + 5];
      fVar11 = B[6];
      fVar12 = C[lVar18 * 2 + 6];
      iVar16 = iVar16 + 1;
      this->m_setElemOperations = iVar16;
      *(float *)((long)pfVar14 + lVar18 + (long)(iVar13 * row) * 4 + (long)col * 4) =
           fVar11 * fVar12 +
           fVar9 * fVar10 + fVar7 * fVar8 + fVar5 * fVar6 + fVar3 * fVar4 + fVar1 * fVar2;
    }
    B = B + 8;
    row = row + 1;
  }
  return;
}

Assistant:

void multiply2_p8r (const btScalar *B, const btScalar *C,  int numRows,  int numRowsOther, int row, int col)
	{
		btAssert (numRows>0 && numRowsOther>0 && B && C);
		const btScalar *bb = B;
		for ( int i = 0;i<numRows;i++)
		{
			const btScalar *cc = C;
			for ( int j = 0;j<numRowsOther;j++)
			{
				btScalar sum;
				sum  = bb[0]*cc[0];
				sum += bb[1]*cc[1];
				sum += bb[2]*cc[2];
				sum += bb[4]*cc[4];
				sum += bb[5]*cc[5];
				sum += bb[6]*cc[6];
				setElem(row+i,col+j,sum);
				cc += 8;
			}
			bb += 8;
		}
	}